

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O0

QRect __thiscall
QTableViewPrivate::intersectedRect
          (QTableViewPrivate *this,QRect rect,QModelIndex *topLeft,QModelIndex *bottomRight)

{
  minMaxPair bounds;
  minMaxPair bounds_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  QModelIndex *in_RCX;
  QTableViewPrivate *in_RDI;
  QModelIndex *in_R8;
  long in_FS_OFFSET;
  QTableView *q;
  QRect updateRect;
  minMaxPair xVals;
  QRect intersected;
  QRect colRect;
  minMaxPair yVals;
  anon_class_8_1_54a39811 calcMinMax;
  int in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  QRect *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  QRect *this_00;
  int local_90;
  int local_8c;
  pair<int,_int> local_88;
  minMaxPair local_80;
  undefined1 local_78 [32];
  undefined1 *local_58;
  undefined1 *local_50;
  int local_48;
  int local_44;
  pair<int,_int> local_40;
  minMaxPair local_38;
  QTableView *local_30;
  QRect local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = q_func(in_RDI);
  local_38 = (minMaxPair)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = (QRect *)in_RDI->verticalHeader;
  iVar2 = QModelIndex::row(in_RCX);
  iVar3 = QModelIndex::row(in_R8);
  local_44 = QRect::top((QRect *)0x8b3327);
  local_48 = QRect::bottom((QRect *)0x8b333b);
  std::pair<int,_int>::pair<int,_int,_true>(&local_40,&local_44,&local_48);
  bounds.second = iVar3;
  bounds.first = iVar2;
  local_38 = intersectedRect::anon_class_8_1_54a39811::operator()
                       ((anon_class_8_1_54a39811 *)this_00,(QHeaderView *)in_RDI,
                        (int)((ulong)in_RCX >> 0x20),(int)in_RCX,bounds);
  if (local_38.first == local_38.second) {
    QRect::QRect(in_stack_ffffffffffffff00);
  }
  else {
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    QRect::left((QRect *)0x8b33d6);
    QPoint::QPoint((QPoint *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
                   in_stack_fffffffffffffef8);
    QRect::right((QRect *)0x8b33f9);
    QPoint::QPoint((QPoint *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
                   in_stack_fffffffffffffef8);
    QRect::QRect(this_00,(QPoint *)in_RDI,
                 (QPoint *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
    local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._0_16_ =
         (undefined1  [16])
         QRect::intersected(in_stack_ffffffffffffff00,
                            (QRect *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    bVar1 = QRect::isNull(in_stack_ffffffffffffff00);
    if (bVar1) {
      QRect::QRect(in_stack_ffffffffffffff00);
    }
    else {
      local_80 = (minMaxPair)&DAT_aaaaaaaaaaaaaaaa;
      iVar4 = QModelIndex::column(in_RCX);
      iVar5 = QModelIndex::column(in_R8);
      local_8c = QRect::left((QRect *)0x8b34dd);
      local_90 = QRect::right((QRect *)0x8b34ee);
      std::pair<int,_int>::pair<int,_int,_true>(&local_88,&local_8c,&local_90);
      bounds_00.second = iVar3;
      bounds_00.first = iVar2;
      local_80 = intersectedRect::anon_class_8_1_54a39811::operator()
                           ((anon_class_8_1_54a39811 *)this_00,(QHeaderView *)in_RDI,
                            (int)((ulong)in_RCX >> 0x20),(int)in_RCX,bounds_00);
      QPoint::QPoint((QPoint *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
                     in_stack_fffffffffffffef8);
      QPoint::QPoint((QPoint *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
                     in_stack_fffffffffffffef8);
      QRect::QRect(this_00,(QPoint *)in_RDI,(QPoint *)CONCAT44(iVar5,iVar4));
      local_18 = QRect::intersected(in_stack_ffffffffffffff00,
                                    (QRect *)CONCAT44(in_stack_fffffffffffffefc,
                                                      in_stack_fffffffffffffef8));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_18;
  }
  __stack_chk_fail();
}

Assistant:

QRect QTableViewPrivate::intersectedRect(const QRect rect, const QModelIndex &topLeft, const QModelIndex &bottomRight) const
{
    Q_Q(const QTableView);

    using minMaxPair = std::pair<int, int>;
    const auto calcMinMax = [q](QHeaderView *hdr, int startIdx, int endIdx, minMaxPair bounds) -> minMaxPair
    {
        minMaxPair ret(std::numeric_limits<int>::max(), std::numeric_limits<int>::min());
        if (hdr->sectionsMoved()) {
            for (int i = startIdx; i <= endIdx; ++i) {
                const int start = hdr->sectionViewportPosition(i);
                const int end = start + hdr->sectionSize(i);
                ret.first = std::min(start, ret.first);
                ret.second = std::max(end, ret.second);
                if (ret.first <= bounds.first && ret.second >= bounds.second)
                    break;
            }
        } else {
            if (q->isRightToLeft() && q->horizontalHeader() == hdr)
                std::swap(startIdx, endIdx);
            ret.first = hdr->sectionViewportPosition(startIdx);
            ret.second = hdr->sectionViewportPosition(endIdx) +
                         hdr->sectionSize(endIdx);
        }
        return ret;
    };

    const auto yVals = calcMinMax(verticalHeader, topLeft.row(), bottomRight.row(),
                                  minMaxPair(rect.top(), rect.bottom()));
    if (yVals.first == yVals.second) // all affected rows are hidden
        return QRect();

    // short circuit: check if no row is inside rect
    const QRect colRect(QPoint(rect.left(), yVals.first),
                        QPoint(rect.right(), yVals.second));
    const QRect intersected = rect.intersected(colRect);
    if (intersected.isNull())
        return QRect();

    const auto xVals = calcMinMax(horizontalHeader, topLeft.column(), bottomRight.column(),
                                  minMaxPair(rect.left(), rect.right()));
    const QRect updateRect(QPoint(xVals.first, yVals.first),
                           QPoint(xVals.second, yVals.second));
    return rect.intersected(updateRect);
}